

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase915::run(TestCase915 *this)

{
  bool bVar1;
  int iVar2;
  NullableValue<kj::Exception> *pNVar3;
  Exception *pEVar4;
  nfds_t __nfds;
  nfds_t __nfds_00;
  nfds_t __nfds_01;
  nfds_t __nfds_02;
  anon_class_16_2_e49ff63c *func;
  anon_class_16_2_7350114d *func_00;
  bool local_901;
  uint local_900;
  bool _kj_shouldLog_8;
  SourceLocation local_8f8;
  uint local_8e0;
  DebugExpression<unsigned_int> local_8dc;
  undefined1 local_8d8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_6;
  undefined1 local_8b0 [6];
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  ArrayPtr<const_char> local_8a0;
  bool local_88a;
  DebugExpression<bool> local_889;
  Exception *pEStack_888;
  DebugExpression<bool> _kjCondition_5;
  Exception *e_1;
  undefined1 *local_878;
  Maybe<kj::Exception> local_870;
  undefined1 local_6d8 [8];
  NullableValue<kj::Exception> _e934;
  SourceLocation local_538;
  bool local_51a;
  bool local_519;
  undefined1 local_518 [6];
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  ArrayPtr<const_char> local_508;
  bool local_4f2;
  DebugExpression<bool> local_4f1;
  Exception *pEStack_4f0;
  DebugExpression<bool> _kjCondition_4;
  Exception *e;
  undefined1 *local_4e0;
  Maybe<kj::Exception> local_4d8;
  undefined1 local_340 [8];
  NullableValue<kj::Exception> _e932;
  bool local_192;
  undefined1 auStack_190 [6];
  bool _kj_shouldLog_3;
  uint local_180;
  bool local_174;
  DebugExpression<bool> local_173;
  bool local_172;
  undefined1 auStack_170 [5];
  DebugExpression<bool> _kjCondition_3;
  bool _kj_shouldLog_2;
  uint local_160;
  bool local_154;
  DebugExpression<bool> local_153;
  bool local_152;
  undefined1 auStack_150 [5];
  DebugExpression<bool> _kjCondition_2;
  bool _kj_shouldLog_1;
  uint local_140;
  bool local_134;
  DebugExpression<bool> local_133;
  bool local_132;
  undefined1 auStack_130 [5];
  DebugExpression<bool> _kjCondition_1;
  bool _kj_shouldLog;
  uint local_120;
  bool local_112;
  DebugExpression<bool> local_111;
  DebugExpression<bool> _kjCondition;
  Canceler local_108;
  Promise<unsigned_int> nowI;
  Promise<void> local_f8;
  Promise<void> local_f0;
  undefined1 local_e8 [8];
  Promise<unsigned_int> neverI;
  Canceler local_d8;
  Promise<void> now;
  undefined1 local_c8 [8];
  Promise<void> never;
  Canceler canceler;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase915 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  Canceler::Canceler((Canceler *)&never);
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)&now);
  Canceler::wrap<void>((Canceler *)local_c8,&never);
  Promise<void>::~Promise(&now);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)&neverI);
  Canceler::wrap<void>(&local_d8,&never);
  Promise<void>::~Promise((Promise<void> *)&neverI);
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)&local_f8);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase915::run()::__0>
            (&local_f0,(Type *)&local_f8);
  Canceler::wrap<unsigned_int>((Canceler *)local_e8,(Promise<unsigned_int> *)&never);
  Promise<unsigned_int>::~Promise((Promise<unsigned_int> *)&local_f0);
  Promise<void>::~Promise(&local_f8);
  Promise<unsigned_int>::Promise((Promise<unsigned_int> *)&stack0xfffffffffffffef0,0x7b);
  Canceler::wrap<unsigned_int>(&local_108,(Promise<unsigned_int> *)&never);
  Promise<unsigned_int>::~Promise((Promise<unsigned_int> *)&stack0xfffffffffffffef0);
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_130,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x39d,0x23);
  iVar2 = Promise<void>::poll((Promise<void> *)local_c8,(pollfd *)local_a8,__nfds,local_120);
  local_112 = (bool)(~(byte)iVar2 & 1);
  local_111 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_112);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_111);
  if (!bVar1) {
    local_132 = kj::_::Debug::shouldLog(ERROR);
    while (local_132 != false) {
      kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x39d,ERROR,"\"failed: expected \" \"!never.poll(waitScope)\", _kjCondition",
                 (char (*) [40])"failed: expected !never.poll(waitScope)",&local_111);
      local_132 = false;
    }
  }
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_150,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x39e,0x20);
  iVar2 = Promise<void>::poll((Promise<void> *)&local_d8,(pollfd *)local_a8,__nfds_00,local_140);
  local_134 = (bool)((byte)iVar2 & 1);
  local_133 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_134);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_133);
  if (!bVar1) {
    local_152 = kj::_::Debug::shouldLog(ERROR);
    while (local_152 != false) {
      kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x39e,ERROR,"\"failed: expected \" \"now.poll(waitScope)\", _kjCondition",
                 (char (*) [37])"failed: expected now.poll(waitScope)",&local_133);
      local_152 = false;
    }
  }
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_170,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x39f,0x24);
  iVar2 = Promise<unsigned_int>::poll
                    ((Promise<unsigned_int> *)local_e8,(pollfd *)local_a8,__nfds_01,local_160);
  local_154 = (bool)(~(byte)iVar2 & 1);
  local_153 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_154);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_153);
  if (!bVar1) {
    local_172 = kj::_::Debug::shouldLog(ERROR);
    while (local_172 != false) {
      kj::_::Debug::log<char_const(&)[41],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x39f,ERROR,"\"failed: expected \" \"!neverI.poll(waitScope)\", _kjCondition",
                 (char (*) [41])"failed: expected !neverI.poll(waitScope)",&local_153);
      local_172 = false;
    }
  }
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_190,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x3a0,0x21);
  iVar2 = Promise<unsigned_int>::poll
                    ((Promise<unsigned_int> *)&local_108,(pollfd *)local_a8,__nfds_02,local_180);
  local_174 = (bool)((byte)iVar2 & 1);
  local_173 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_174);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_173);
  if (!bVar1) {
    local_192 = kj::_::Debug::shouldLog(ERROR);
    while (local_192 != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x3a0,ERROR,"\"failed: expected \" \"nowI.poll(waitScope)\", _kjCondition",
                 (char (*) [38])"failed: expected nowI.poll(waitScope)",&local_173);
      local_192 = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)&_e932.field_1.value.details.builder.disposer,"foobar");
  Canceler::cancel((Canceler *)&never,(StringPtr)stack0xfffffffffffffe58);
  e = (Exception *)local_c8;
  local_4e0 = local_a8;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase915::run()::__1>
            (&local_4d8,(kj *)&e,func);
  pNVar3 = kj::_::readMaybe<kj::Exception>(&local_4d8);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_340,pNVar3);
  Maybe<kj::Exception>::~Maybe(&local_4d8);
  pEVar4 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_340);
  if (pEVar4 == (Exception *)0x0) {
    local_51a = kj::_::Debug::shouldLog(ERROR);
    while (local_51a != false) {
      kj::_::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x3a4,ERROR,"\"code did not throw: \" \"never.wait(waitScope)\"",
                 (char (*) [42])"code did not throw: never.wait(waitScope)");
      local_51a = false;
    }
  }
  else {
    pEStack_4f0 = kj::_::NullableValue<kj::Exception>::operator*
                            ((NullableValue<kj::Exception> *)local_340);
    local_508 = (ArrayPtr<const_char>)Exception::getDescription(pEStack_4f0);
    StringPtr::StringPtr((StringPtr *)local_518,"foobar");
    local_4f2 = StringPtr::contains((StringPtr *)&local_508,(StringPtr *)local_518);
    local_4f1 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4f2);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_4f1);
    if (!bVar1) {
      local_519 = kj::_::Debug::shouldLog(ERROR);
      while (local_519 != false) {
        kj::_::Debug::
        log<char_const(&)[55],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                   ,0x3a4,ERROR,
                   "\"failed: expected \" \"e.getDescription().contains(\\\"foobar\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                   ,(char (*) [55])"failed: expected e.getDescription().contains(\"foobar\")",
                   &local_4f1,
                   (char (*) [56])"exception description didn\'t contain expected substring",
                   pEStack_4f0);
        local_519 = false;
      }
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_340);
  SourceLocation::SourceLocation
            (&local_538,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x3a5,3);
  Promise<void>::wait((Promise<void> *)&local_d8,local_a8);
  e_1 = (Exception *)local_e8;
  local_878 = local_a8;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase915::run()::__2>
            (&local_870,(kj *)&e_1,func_00);
  pNVar3 = kj::_::readMaybe<kj::Exception>(&local_870);
  kj::_::NullableValue<kj::Exception>::NullableValue
            ((NullableValue<kj::Exception> *)local_6d8,pNVar3);
  Maybe<kj::Exception>::~Maybe(&local_870);
  pEVar4 = kj::_::NullableValue::operator_cast_to_Exception_((NullableValue *)local_6d8);
  if (pEVar4 == (Exception *)0x0) {
    _kjCondition_6._30_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._30_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[43]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x3a6,ERROR,"\"code did not throw: \" \"neverI.wait(waitScope)\"",
                 (char (*) [43])"code did not throw: neverI.wait(waitScope)");
      _kjCondition_6._30_1_ = 0;
    }
  }
  else {
    pEStack_888 = kj::_::NullableValue<kj::Exception>::operator*
                            ((NullableValue<kj::Exception> *)local_6d8);
    local_8a0 = (ArrayPtr<const_char>)Exception::getDescription(pEStack_888);
    StringPtr::StringPtr((StringPtr *)local_8b0,"foobar");
    local_88a = StringPtr::contains((StringPtr *)&local_8a0,(StringPtr *)local_8b0);
    local_889 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_88a);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_889);
    if (!bVar1) {
      _kjCondition_6._31_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_6._31_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[55],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                   ,0x3a6,ERROR,
                   "\"failed: expected \" \"e.getDescription().contains(\\\"foobar\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                   ,(char (*) [55])"failed: expected e.getDescription().contains(\"foobar\")",
                   &local_889,
                   (char (*) [56])"exception description didn\'t contain expected substring",
                   pEStack_888);
        _kjCondition_6._31_1_ = 0;
      }
    }
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_6d8);
  SourceLocation::SourceLocation
            (&local_8f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x3a7,0x29);
  local_8e0 = Promise<unsigned_int>::wait((Promise<unsigned_int> *)&local_108,local_a8);
  local_8dc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_8e0);
  local_900 = 0x7b;
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_8d8,&local_8dc,&local_900);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8d8);
  if (!bVar1) {
    local_901 = kj::_::Debug::shouldLog(ERROR);
    while (local_901 != false) {
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<unsigned_int,unsigned_int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x3a7,ERROR,"\"failed: expected \" \"nowI.wait(waitScope) == 123u\", _kjCondition"
                 ,(char (*) [46])"failed: expected nowI.wait(waitScope) == 123u",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_8d8);
      local_901 = false;
    }
  }
  Promise<unsigned_int>::~Promise((Promise<unsigned_int> *)&local_108);
  Promise<unsigned_int>::~Promise((Promise<unsigned_int> *)local_e8);
  Promise<void>::~Promise((Promise<void> *)&local_d8);
  Promise<void>::~Promise((Promise<void> *)local_c8);
  Canceler::~Canceler((Canceler *)&never);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, Canceler) {
  EventLoop loop;
  WaitScope waitScope(loop);
  Canceler canceler;

  auto never = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE));
  auto now = canceler.wrap(kj::Promise<void>(kj::READY_NOW));
  auto neverI = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE).then([]() { return 123u; }));
  auto nowI = canceler.wrap(kj::Promise<uint>(123u));

  KJ_EXPECT(!never.poll(waitScope));
  KJ_EXPECT(now.poll(waitScope));
  KJ_EXPECT(!neverI.poll(waitScope));
  KJ_EXPECT(nowI.poll(waitScope));

  canceler.cancel("foobar");

  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("foobar", never.wait(waitScope));
  now.wait(waitScope);
  KJ_EXPECT_THROW_MESSAGE("foobar", neverI.wait(waitScope));
  KJ_EXPECT(nowI.wait(waitScope) == 123u);
}